

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

uint64_t m68k_read_disassembler_64(m68k_info *info,uint64_t addr)

{
  uint64_t v7;
  uint64_t v6;
  uint64_t v5;
  uint64_t v4;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  uint64_t addr_local;
  m68k_info *info_local;
  
  return (ulong)info->code[addr] << 0x38 | (ulong)info->code[addr + 1] << 0x30 |
         (ulong)info->code[addr + 2] << 0x28 | (ulong)info->code[addr + 3] << 0x20 |
         (ulong)info->code[addr + 4] << 0x18 | (ulong)info->code[addr + 5] << 0x10 |
         (ulong)info->code[addr + 6] << 8 | (ulong)info->code[addr + 7];
}

Assistant:

static uint64_t m68k_read_disassembler_64(const m68k_info *info, const uint64_t addr)
{
	const uint64_t v0 = info->code[addr + 0];
	const uint64_t v1 = info->code[addr + 1];
	const uint64_t v2 = info->code[addr + 2];
	const uint64_t v3 = info->code[addr + 3];
	const uint64_t v4 = info->code[addr + 4];
	const uint64_t v5 = info->code[addr + 5];
	const uint64_t v6 = info->code[addr + 6];
	const uint64_t v7 = info->code[addr + 7];
	return (v0 << 56) | (v1 << 48) | (v2 << 40) | (v3 << 32) | (v4 << 24) | (v5 << 16) | (v6 << 8) | v7;
}